

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void buffer_write_read_vector_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_wrap_stringstream<char> *pbVar2;
  const_string local_250;
  const_string local_240;
  const_string local_230;
  const_string local_220;
  const_string local_210;
  basic_wrap_stringstream<char> local_200;
  const_string local_68;
  const_string local_58;
  const_string local_48;
  const_string local_38;
  const_string local_28;
  
  local_210.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_210.m_end = "";
  memset(&local_200,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_200);
  std::operator<<((ostream *)&local_200,'\"');
  std::operator<<((ostream *)&local_200,"buffer_write_read_vector");
  std::operator<<((ostream *)&local_200,"\" fixture ctor");
  pbVar2 = &local_200;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_28.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_28.m_end = local_28.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_210,0x56,&local_28);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_200);
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_220.m_end = "";
  memset(&local_200,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_200);
  std::operator<<((ostream *)&local_200,'\"');
  std::operator<<((ostream *)&local_200,"buffer_write_read_vector");
  std::operator<<((ostream *)&local_200,"\" fixture setup");
  pbVar2 = &local_200;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_38.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_38.m_end = local_38.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_220,0x56,&local_38);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_200);
  local_230.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_230.m_end = "";
  memset(&local_200,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_200);
  std::operator<<((ostream *)&local_200,'\"');
  std::operator<<((ostream *)&local_200,"buffer_write_read_vector");
  std::operator<<((ostream *)&local_200,"\" test entry");
  pbVar2 = &local_200;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_48.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_48.m_end = local_48.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_230,0x56,&local_48);
  pbVar2 = &local_200;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar2);
  buffer_write_read_vector::test_method((buffer_write_read_vector *)pbVar2);
  local_240.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_240.m_end = "";
  memset(&local_200,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_200);
  std::operator<<((ostream *)&local_200,'\"');
  std::operator<<((ostream *)&local_200,"buffer_write_read_vector");
  std::operator<<((ostream *)&local_200,"\" fixture teardown");
  pbVar2 = &local_200;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_58.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_58.m_end = local_58.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_240,0x56,&local_58);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_200);
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_250.m_end = "";
  memset(&local_200,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_200);
  std::operator<<((ostream *)&local_200,'\"');
  std::operator<<((ostream *)&local_200,"buffer_write_read_vector");
  std::operator<<((ostream *)&local_200,"\" fixture dtor");
  pbVar2 = &local_200;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_68.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_68.m_end = local_68.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_250,0x56,&local_68);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_200);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(buffer_write_read_vector)
{
    buffer buffer;

    std::vector<uint32_t> wvector = {0, 2, 4, 6, 8};
    buffer_writer writer(buffer);
    writer << wvector;

    std::vector<uint32_t> rvector;
    buffer_reader reader(buffer);
    reader >> rvector;

    BOOST_TEST(wvector == rvector);
}